

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall
mocker::SemanticChecker::collectSymbols::Collect::operator()(Collect *this,VarDecl *decl)

{
  ScopeID *pSVar1;
  SemanticContext *pSVar2;
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *this_00;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  DuplicatedSymbols *this_01;
  mapped_type *pos;
  NodeID local_a0 [3];
  enable_shared_from_this<mocker::ast::ASTNode> local_88;
  shared_ptr<mocker::ast::ASTNode> local_78;
  shared_ptr<mocker::ast::Declaration> local_68;
  undefined1 local_51;
  undefined1 local_50 [7];
  bool res;
  string varName;
  VarDecl *decl_local;
  Collect *this_local;
  
  pSVar1 = this->scope;
  SymTbl::global((ScopeID *)((long)&varName.field_2 + 8),&this->ctx->syms);
  bVar3 = ScopeID::operator==(pSVar1,(ScopeID *)((long)&varName.field_2 + 8));
  ScopeID::~ScopeID((ScopeID *)((long)&varName.field_2 + 8));
  if (!bVar3) {
    peVar4 = std::
             __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&decl->decl);
    peVar5 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->identifier);
    std::__cxx11::string::string((string *)local_50,(string *)&peVar5->val);
    pSVar1 = this->scope;
    pSVar2 = this->ctx;
    std::enable_shared_from_this<mocker::ast::ASTNode>::shared_from_this(&local_88);
    std::static_pointer_cast<mocker::ast::VarDecl,mocker::ast::ASTNode>(&local_78);
    std::shared_ptr<mocker::ast::Declaration>::shared_ptr<mocker::ast::VarDecl,void>
              (&local_68,(shared_ptr<mocker::ast::VarDecl> *)&local_78);
    bVar3 = SymTbl::addSymbol(&pSVar2->syms,pSVar1,(string *)local_50,&local_68);
    std::shared_ptr<mocker::ast::Declaration>::~shared_ptr(&local_68);
    std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr
              ((shared_ptr<mocker::ast::VarDecl> *)&local_78);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr
              ((shared_ptr<mocker::ast::ASTNode> *)&local_88);
    local_51 = bVar3;
    if (!bVar3) {
      this_01 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
      this_00 = this->pos;
      local_a0[0] = ast::ASTNode::getID((ASTNode *)decl);
      pos = std::
            unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
            ::at(this_00,local_a0);
      DuplicatedSymbols::DuplicatedSymbols(this_01,pos,(string *)local_50);
      __cxa_throw(this_01,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void operator()(ast::VarDecl &decl) const override {
#ifdef DISABLE_FORWARD_REFERENCE_FOR_GLOBAL_VAR
      if (scope == ctx.syms.global())
        return;
#endif
      std::string varName = decl.decl->identifier->val;
      auto res = ctx.syms.addSymbol(
          scope, varName,
          std::static_pointer_cast<ast::VarDecl>(decl.shared_from_this()));
      if (!res)
        throw DuplicatedSymbols(pos.at(decl.getID()), varName);
    }